

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

htab_hash_t mem_expr_hash(mem_expr_t e,void *arg)

{
  byte bVar1;
  MIR_insn_t pMVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  pMVar2 = e->insn;
  if ((*(uint *)&pMVar2->field_0x18 & 0xfffffffc) != 0) {
    __assert_fail("move_code_p (st->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xe7e,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
  }
  lVar15 = 0x50;
  if (pMVar2->ops[0].field_0x8 == '\v') {
    lVar15 = 0x20;
  }
  if (*(char *)((long)pMVar2->ops + lVar15 + -0x18) == '\v') {
    lVar3 = *(long *)((long)pMVar2->ops + lVar15 + -0x20);
    if (lVar3 == 0) {
      uVar14 = 0x23;
    }
    else {
      lVar3 = *(long *)(lVar3 + 8);
      auVar12 = ZEXT116(*(byte *)(lVar3 + 8)) * ZEXT816(0x65862b62bdf5ef4d);
      uVar14 = auVar12._8_8_ + auVar12._0_8_ ^ 0x23;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar14;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(lVar3 + 0x18);
      uVar14 = SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar11,8) +
               SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar11,0) ^
               (ulong)((uint)uVar14 ^
                      SUB164(auVar12 * ZEXT816(0x288eea216831e6a7),8) +
                      SUB164(auVar12 * ZEXT816(0x288eea216831e6a7),0));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar14;
      uVar14 = (ulong)((uint)uVar14 ^
                      SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),8) +
                      SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),0));
    }
    bVar1 = *(byte *)((long)pMVar2->ops + lVar15 + -0x10);
    uVar13 = (ulong)bVar1;
    if (bVar1 == 7) {
      uVar13 = 6;
    }
    else if (bVar1 == 0xb) {
      uVar13 = 4;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar13;
    uVar14 = SUB168(auVar5 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar5 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar14;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14;
    auVar12 = ZEXT416(*(uint *)((long)pMVar2->ops + lVar15 + -0xc)) * ZEXT816(0x65862b62bdf5ef4d);
    uVar14 = auVar12._8_8_ + auVar12._0_8_ ^
             (ulong)((uint)uVar14 ^
                    SUB164(auVar6 * ZEXT816(0x288eea216831e6a7),8) +
                    SUB164(auVar6 * ZEXT816(0x288eea216831e6a7),0));
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar14;
    auVar12 = ZEXT416(*(uint *)((long)pMVar2->ops + lVar15 + -8)) * ZEXT816(0x65862b62bdf5ef4d);
    uVar14 = auVar12._8_8_ + auVar12._0_8_ ^
             (ulong)((uint)uVar14 ^
                    SUB164(auVar7 * ZEXT816(0x288eea216831e6a7),8) +
                    SUB164(auVar7 * ZEXT816(0x288eea216831e6a7),0));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar14;
    uVar14 = CONCAT44(0,(uint)uVar14 ^
                        SUB164(auVar8 * ZEXT816(0x288eea216831e6a7),8) +
                        SUB164(auVar8 * ZEXT816(0x288eea216831e6a7),0));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar14;
    uVar14 = SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar9 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar14;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar14;
    return (uint)uVar14 ^
           SUB164(auVar10 * ZEXT816(0x288eea216831e6a7),8) +
           SUB164(auVar10 * ZEXT816(0x288eea216831e6a7),0);
  }
  __assert_fail("op_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe80,"htab_hash_t mem_expr_hash(mem_expr_t, void *)");
}

Assistant:

static htab_hash_t mem_expr_hash (mem_expr_t e, void *arg MIR_UNUSED) {
  MIR_insn_t st = e->insn;
  MIR_op_t *op_ref;
  ssa_edge_t ssa_edge;
  htab_hash_t h = (htab_hash_t) mir_hash_init (0x23);

  gen_assert (move_code_p (st->code));
  op_ref = st->ops[0].mode == MIR_OP_VAR_MEM ? &st->ops[0] : &st->ops[1];
  gen_assert (op_ref->mode == MIR_OP_VAR_MEM);
  if ((ssa_edge = op_ref->data) != NULL) {
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val_const_p);
    h = (htab_hash_t) mir_hash_step (h, (uint64_t) ssa_edge->def->gvn_val);
  }
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) canonic_mem_type (op_ref->u.var_mem.type));
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.alias);
  h = (htab_hash_t) mir_hash_step (h, (uint64_t) op_ref->u.var_mem.nonalias);
  return (htab_hash_t) mir_hash_finish (h);
}